

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrMapImpl.cpp
# Opt level: O0

int __thiscall xercesc_4_0::DOMAttrMapImpl::findNamePoint(DOMAttrMapImpl *this,XMLCh *name)

{
  int iVar1;
  XMLSize_t XVar2;
  DOMNode *pDVar3;
  undefined4 extraout_var;
  int local_2c;
  int test;
  int last;
  int first;
  int i;
  XMLCh *name_local;
  DOMAttrMapImpl *this_local;
  
  last = 0;
  if (this->fNodes != (DOMNodeVector *)0x0) {
    test = 0;
    XVar2 = DOMNodeVector::size(this->fNodes);
    local_2c = (int)XVar2 + -1;
    while (test <= local_2c) {
      last = (test + local_2c) / 2;
      pDVar3 = DOMNodeVector::elementAt(this->fNodes,(long)last);
      iVar1 = (*pDVar3->_vptr_DOMNode[2])();
      iVar1 = XMLString::compareString(name,(XMLCh *)CONCAT44(extraout_var,iVar1));
      if (iVar1 == 0) {
        return last;
      }
      if (iVar1 < 0) {
        local_2c = last + -1;
      }
      else {
        test = last + 1;
      }
    }
    if (last < test) {
      last = test;
    }
  }
  return -1 - last;
}

Assistant:

int DOMAttrMapImpl::findNamePoint(const XMLCh *name) const
{
    // Binary search
    int i=0;
    if(fNodes!=0)
    {
        int first=0,last=(int)fNodes->size()-1;

        while(first<=last)
        {
            i=(first+last)/2;
            int test = XMLString::compareString(name, fNodes->elementAt(i)->getNodeName());
            if(test==0)
                return i; // Name found
            else if(test<0)
                last=i-1;
            else
                first=i+1;
        }
        if(first>i) i=first;
    }
    /********************
    // Linear search
    int i = 0;
    if (fNodes != 0)
    for (i = 0; i < fNodes.size(); ++i)
    {
    int test = name.compareTo(((NodeImpl *) (fNodes.elementAt(i))).getNodeName());
    if (test == 0)
    return i;
    else
    if (test < 0)
    {
    break; // Found insertpoint
    }
    }

    *******************/
    return -1 - i; // not-found has to be encoded.
}